

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cc
# Opt level: O0

Pipeline * __thiscall Pipeline::operator<<(Pipeline *this,short i)

{
  string local_38;
  short local_12;
  Pipeline *pPStack_10;
  short i_local;
  Pipeline *this_local;
  
  local_12 = i;
  pPStack_10 = this;
  std::__cxx11::to_string(&local_38,(int)i);
  writeString(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

Pipeline&
Pipeline::operator<<(short i)
{
    this->writeString(std::to_string(i));
    return *this;
}